

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::OnImport
          (BinaryReaderLogging *this,Index index,ExternalKind kind,string_view module_name,
          string_view field_name)

{
  Enum EVar1;
  char *pcVar2;
  
  WriteIndent(this);
  if (kind < (Last|Table)) {
    pcVar2 = *(char **)(g_kind_name + (ulong)kind * 8);
  }
  else {
    pcVar2 = "<error_kind>";
  }
  Stream::Writef(this->stream_,"OnImport(index: %u, kind: %s, module: \"%.*s\", field: \"%.*s\")\n",
                 (ulong)index,pcVar2,module_name._M_len & 0xffffffff,module_name._M_str,
                 (ulong)(uint)field_name._M_len,field_name._M_str);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x11])
                    (this->reader_,(ulong)index,(ulong)kind,module_name._M_len,module_name._M_str);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImport(Index index,
                                     ExternalKind kind,
                                     std::string_view module_name,
                                     std::string_view field_name) {
  LOGF("OnImport(index: %" PRIindex ", kind: %s, module: \"" PRIstringview
       "\", field: \"" PRIstringview "\")\n",
       index, GetKindName(kind), WABT_PRINTF_STRING_VIEW_ARG(module_name),
       WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return reader_->OnImport(index, kind, module_name, field_name);
}